

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O2

void Extra_NtkPowerTest(void)

{
  uint uVar1;
  word wVar2;
  uint uVar3;
  uint local_40;
  undefined4 local_3c;
  word local_38;
  
  for (wVar2 = 0; local_3c = (undefined4)wVar2, wVar2 != 0x10; wVar2 = wVar2 + 1) {
    for (uVar3 = 0; uVar3 != 0x10; uVar3 = uVar3 + 1) {
      local_38 = wVar2;
      for (uVar1 = 1; uVar1 < uVar3; uVar1 = uVar1 + 1) {
        local_38 = local_38 * wVar2;
      }
      local_40 = uVar3;
      Extra_NtkPrintBin((word *)&local_3c,4);
      Extra_NtkPrintBin((word *)&local_40,4);
      putchar(0x20);
      Extra_NtkPrintBin(&local_38,0x40);
      putchar(10);
    }
  }
  return;
}

Assistant:

void Extra_NtkPowerTest()
{
    int i, j, k, n = 4;
    for ( i = 0; i < (1<<n); i++ )
    for ( j = 0; j < (1<<n); j++ )
    {
        word t = (word)i;
        for ( k = 1; k < j; k++ )
            t *= (word)i;
        Extra_NtkPrintBin( (word *)&i, n );
        Extra_NtkPrintBin( (word *)&j, n );
        printf( " " );
        Extra_NtkPrintBin( (word *)&t, 64 );
        printf( "\n" );
    }
}